

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O0

int Frc_ManCrossCut2_rec(Frc_Man_t *p,Frc_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  uint local_24;
  Frc_Obj_t *pFStack_20;
  int i;
  Frc_Obj_t *pFanin;
  Frc_Obj_t *pObj_local;
  Frc_Man_t *p_local;
  
  if (pObj->iFanout == 0) {
    __assert_fail("pObj->iFanout > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaForce.c"
                  ,0x279,"int Frc_ManCrossCut2_rec(Frc_Man_t *, Frc_Obj_t *)");
  }
  uVar1 = pObj->iFanout;
  pObj->iFanout = uVar1 - 1;
  if (uVar1 == pObj->nFanouts) {
    p->nCutCur = p->nCutCur + 1;
    iVar2 = Abc_MaxInt(p->nCutMax,p->nCutCur);
    p->nCutMax = iVar2;
    iVar2 = Frc_ObjIsCi(pObj);
    if (iVar2 == 0) {
      local_24 = *(uint *)pObj >> 4;
      while( true ) {
        local_24 = local_24 - 1;
        bVar3 = false;
        if (-1 < (int)local_24) {
          pFStack_20 = Frc_ObjFanin(pObj,local_24);
          bVar3 = pFStack_20 != (Frc_Obj_t *)0x0;
        }
        if (!bVar3) break;
        iVar2 = Frc_ManCrossCut2_rec(p,pFStack_20);
        p->nCutCur = p->nCutCur - iVar2;
      }
    }
  }
  return (int)(pObj->iFanout == 0);
}

Assistant:

int Frc_ManCrossCut2_rec( Frc_Man_t * p, Frc_Obj_t * pObj )
{
    assert( pObj->iFanout > 0 );
    if ( pObj->iFanout-- == pObj->nFanouts )
    {
        Frc_Obj_t * pFanin;
        int i;
        p->nCutCur++;
        p->nCutMax = Abc_MaxInt( p->nCutMax, p->nCutCur );
        if ( !Frc_ObjIsCi(pObj) )
            Frc_ObjForEachFaninReverse( pObj, pFanin, i )
                p->nCutCur -= Frc_ManCrossCut2_rec( p, pFanin );
    }
    return pObj->iFanout == 0;
}